

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::Assembler::comment(Assembler *this,char *s,size_t len)

{
  Logger *pLVar1;
  Error EVar2;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if ((EVar2 == 0) && (EVar2 = 0, ((this->super_CodeEmitter)._globalOptions & 4) != 0)) {
    pLVar1 = ((this->super_CodeEmitter)._code)->_logger;
    (*pLVar1->_vptr_Logger[2])(pLVar1);
    (*pLVar1->_vptr_Logger[2])(pLVar1,"\n",1);
  }
  return EVar2;
}

Assistant:

Error Assembler::comment(const char* s, size_t len) {
  if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    Logger* logger = _code->getLogger();
    logger->log(s, len);
    logger->log("\n", 1);
    return kErrorOk;
  }
#else
  ASMJIT_UNUSED(s);
  ASMJIT_UNUSED(len);
#endif

  return kErrorOk;
}